

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal.hpp
# Opt level: O0

void __thiscall
unodb::detail::basic_art_key<unsigned_long>::shift_right
          (basic_art_key<unsigned_long> *this,size_t num_bytes)

{
  size_t num_bytes_local;
  basic_art_key<unsigned_long> *this_local;
  
  if (num_bytes < 9) {
    (this->field_0).key = (this->field_0).key >> ((byte)(num_bytes << 3) & 0x3f);
    return;
  }
  __assert_fail("num_bytes <= sizeof(KeyType)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                ,0xc3,
                "void unodb::detail::basic_art_key<unsigned long>::shift_right(const std::size_t) [KeyType = unsigned long]"
               );
}

Assistant:

constexpr void shift_right(const std::size_t num_bytes) noexcept {
    if constexpr (std::is_same_v<KeyType, key_view>) {
      UNODB_DETAIL_ASSERT(num_bytes <= key.size_bytes());
      key = key.subspan(num_bytes);
    } else {
      UNODB_DETAIL_ASSERT(num_bytes <= sizeof(KeyType));
      key >>= (num_bytes * 8);
    }
  }